

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_containers_array.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  enable_if_t<std::is_same_v<decltype((Color)1),_Color>_&&_enum_contains((Color)1),_const_RGB_&>
  pRVar2;
  enable_if_t<std::is_same_v<decltype((Color)2),_Color>_&&_enum_contains((Color)2),_const_RGB_&>
  pRVar3;
  enable_if_t<std::is_same_v<decltype((Color)4),_Color>_&&_enum_contains((Color)4),_const_RGB_&>
  pRVar4;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  color_rgb_initializer;
  array<Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
  local_20;
  
  local_20.a._M_elems[0].r = 0xff;
  local_20.a._M_elems[0].g = '\0';
  local_20.a._M_elems[0].b = '\0';
  local_20.a._M_elems[1].r = '\0';
  local_20.a._M_elems[1].g = 0xff;
  local_20.a._M_elems[1].b = '\0';
  local_20.a._M_elems[2].r = '\0';
  local_20.a._M_elems[2].g = '\0';
  local_20.a._M_elems[2].b = 0xff;
  poVar1 = operator<<((ostream *)&std::cout,(RGB)0xff);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)&std::cout,(RGB)0xff00);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = operator<<((ostream *)&std::cout,(RGB)0xff0000);
  std::endl<char,std::char_traits<char>>(poVar1);
  pRVar2 = magic_enum::containers::
           get<(Color)1,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     (&local_20);
  poVar1 = operator<<((ostream *)&std::cout,*pRVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  pRVar3 = magic_enum::containers::
           get<(Color)2,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     (&local_20);
  poVar1 = operator<<((ostream *)&std::cout,*pRVar3);
  std::endl<char,std::char_traits<char>>(poVar1);
  pRVar4 = magic_enum::containers::
           get<(Color)4,_Color,_RGB,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>
                     (&local_20);
  poVar1 = operator<<((ostream *)&std::cout,*pRVar4);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {

  constexpr magic_enum::containers::array<Color, RGB> color_rgb_initializer {{{{color_max, 0, 0}, {0, color_max, 0}, {0, 0, color_max}}}};

  std::cout << magic_enum::containers::get<0>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<1>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<2>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  std::cout << magic_enum::containers::get<Color::RED>(color_rgb_initializer) << std::endl; // R=255 G=0 B=0
  std::cout << magic_enum::containers::get<Color::GREEN>(color_rgb_initializer) << std::endl; // R=0 G=255 B=0
  std::cout << magic_enum::containers::get<Color::BLUE>(color_rgb_initializer) << std::endl; // R=0 G=0 B=255

  return 0;
}